

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

type * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::operator()(type *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
            *this,double value)

{
  undefined8 *puVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  undefined8 uVar4;
  format_specs local_28;
  
  puVar1 = *(undefined8 **)(this + 0x28);
  if (puVar1 == (undefined8 *)0x0) {
    local_28.super_align_spec.width_ = 0;
    local_28.super_align_spec.fill_ = L' ';
    local_28.super_align_spec.align_ = ALIGN_DEFAULT;
    local_28.super_core_format_specs.precision = -1;
    local_28.super_core_format_specs.flags = '\0';
    local_28.super_core_format_specs.type = '\0';
  }
  else {
    local_28.super_core_format_specs._4_2_ = *(undefined2 *)(puVar1 + 2);
    local_28.super_align_spec._0_8_ = *puVar1;
    local_28._8_8_ = puVar1[1];
  }
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  ::write_double<double>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              *)this,value,&local_28);
  pwVar2 = *(wchar_t **)this;
  sVar3 = *(size_t *)(this + 8);
  uVar4 = *(undefined8 *)(this + 0x18);
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ =
       *(size_t *)(this + 0x10);
  *(undefined8 *)&__return_storage_ptr__->blackhole_ = uVar4;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar2;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sVar3;
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }